

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.cpp
# Opt level: O2

stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* util::rpn_parse_v2(stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *__return_storage_ptr__,string *expr)

{
  _Map_pointer ppoVar1;
  char cVar2;
  _Alloc_hider __lhs;
  bool bVar3;
  int iVar4;
  int iVar5;
  op_stack_t *poVar6;
  char c;
  front_insert_iterator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  it;
  value_type *__x;
  _Self *__x_00;
  _Elt_pointer poVar7;
  _Map_pointer ppoVar8;
  _Map_pointer ppoVar9;
  stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_> local_358;
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_300;
  _Self local_2f8;
  value_type local_2d8;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  stack;
  Lexer lexer;
  stringstream ss;
  
  local_300 = (_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)__return_storage_ptr__;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Deque_base(&stack.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
  local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_map_size = 8;
  local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)operator_new(0x40);
  ppoVar9 = local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
            super__Deque_impl_data._M_map + 4;
  ppoVar1 = local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
            super__Deque_impl_data._M_map + 3;
  for (ppoVar8 = ppoVar1; ppoVar8 < ppoVar9; ppoVar8 = ppoVar8 + 1) {
    poVar6 = (op_stack_t *)operator_new(0x1e0);
    *ppoVar8 = poVar6;
  }
  local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = *ppoVar1;
  local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_start._M_last =
       local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur + 0xc;
  local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_start._M_first =
       local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = ppoVar1;
  local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur =
       local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first =
       local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last =
       local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
       super__Deque_impl_data._M_start._M_last;
  local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = ppoVar1;
  std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)expr,_S_out|_S_in);
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Deque_base(&tokens.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
  Lexer::Lexer(&lexer,(istream *)&ss);
  it.container = &tokens;
  Lexer::
  Lex<std::front_insert_iterator<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&lexer,it);
  local_2f8._M_cur =
       tokens.
       super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_2f8._M_first =
       tokens.
       super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_first;
  local_2f8._M_last =
       tokens.
       super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_last;
  local_2f8._M_node =
       tokens.
       super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_node;
  while (__x = (value_type *)local_2f8._M_cur, c = (char)it.container,
        local_2f8._M_cur !=
        tokens.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    rpn_map_multichar_op(local_2f8._M_cur);
    cVar2 = *(((string *)&(__x->tok)._M_dataplus)->_M_dataplus)._M_p;
    iVar4 = rpn_parse_v2::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)(ulong)(uint)(int)cVar2,c);
    if (iVar4 == 99) {
      if (cVar2 != ')') {
        while (it.container = (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_358.c.
                                 super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                                 super__Deque_impl_data._M_finish._M_cur,
              local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur !=
              local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur) {
          if (local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur ==
              local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
              super__Deque_impl_data._M_finish._M_first) {
            it.container = (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            if (((value_type *)((long)it.container + 0x1b8))->prec == 99) goto LAB_0017448a;
            poVar7 = (_Elt_pointer)((long)it.container + 0x1e0);
          }
          else {
            poVar7 = local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_cur;
            if (local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur[-1].prec == 99) {
LAB_0017448a:
              std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::pop
                        (&local_358);
              break;
            }
          }
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_front(&stack,&poVar7[-1].tok);
          std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::pop
                    (&local_358);
        }
        goto LAB_00174492;
      }
      std::__cxx11::string::string((string *)&local_2d8,(string *)__x);
      local_2d8.prec = 99;
      it.container = (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_2d8;
      std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::push
                (&local_358,&local_2d8);
LAB_001744b8:
      std::__cxx11::string::~string((string *)&local_2d8);
    }
    else {
      if (iVar4 != 0) {
        if (iVar4 - 1U < 0x61) {
          std::operator+((_Self *)&local_2d8,&local_2f8,1);
          if ((_Elt_pointer)local_2d8.tok._M_dataplus._M_p !=
              tokens.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
            __x_00 = &local_2f8;
            std::operator+((_Self *)&local_2d8,__x_00,1);
            __lhs._M_p = local_2d8.tok._M_dataplus._M_p;
            iVar5 = rpn_parse_v2::anon_class_1_0_00000001::operator()
                              ((anon_class_1_0_00000001 *)
                               (ulong)(uint)(int)**(char **)local_2d8.tok._M_dataplus._M_p,
                               (char)__x_00);
            if ((iVar5 == 0) ||
               (bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)__lhs._M_p,")"), !bVar3)) {
              while (it.container = (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_358.c.
                                       super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>.
                                       _M_impl.super__Deque_impl_data._M_finish._M_cur,
                    local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_cur !=
                    local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                    super__Deque_impl_data._M_start._M_cur) {
                if (local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_cur ==
                    local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_first) {
                  it.container = (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_358.c.
                                    super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>.
                                    _M_impl.super__Deque_impl_data._M_finish._M_node[-1];
                  if (iVar4 <= ((value_type *)((long)it.container + 0x1b8))->prec) break;
                  poVar7 = (_Elt_pointer)((long)it.container + 0x1e0);
                }
                else {
                  poVar7 = local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>.
                           _M_impl.super__Deque_impl_data._M_finish._M_cur;
                  if (iVar4 <= local_358.c.
                               super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                               super__Deque_impl_data._M_finish._M_cur[-1].prec) break;
                }
                std::
                deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_front(&stack,&poVar7[-1].tok);
                std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::pop
                          (&local_358);
              }
              goto LAB_00174492;
            }
          }
          if (*(((string *)&(__x->tok)._M_dataplus)->_M_dataplus)._M_p == '-') {
            std::__cxx11::string::operator=((string *)__x,'\a');
          }
          while (local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur !=
                 local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                 super__Deque_impl_data._M_start._M_cur) {
            if (local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur ==
                local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
              if (1 < local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl
                      .super__Deque_impl_data._M_finish._M_node[-1][0xb].prec) break;
              poVar7 = local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>.
                       _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
            }
            else {
              poVar7 = local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>.
                       _M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (1 < local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl
                      .super__Deque_impl_data._M_finish._M_cur[-1].prec) break;
            }
            std::
            deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_front(&stack,&poVar7[-1].tok);
            std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::pop
                      (&local_358);
          }
          iVar4 = 1;
        }
        else {
          while (it.container = (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_358.c.
                                   super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>.
                                   _M_impl.super__Deque_impl_data._M_finish._M_cur,
                local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur !=
                local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur) {
            if (local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur ==
                local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
              it.container = (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_358.c.
                                super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                                super__Deque_impl_data._M_finish._M_node[-1];
              if (iVar4 < ((value_type *)((long)it.container + 0x1b8))->prec) break;
              poVar7 = (_Elt_pointer)((long)it.container + 0x1e0);
            }
            else {
              poVar7 = local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>.
                       _M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (iVar4 < local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>.
                          _M_impl.super__Deque_impl_data._M_finish._M_cur[-1].prec) break;
            }
            std::
            deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_front(&stack,&poVar7[-1].tok);
            std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::pop
                      (&local_358);
          }
LAB_00174492:
          if (0x60 < iVar4 - 1U) goto LAB_001744c0;
        }
        std::__cxx11::string::string((string *)&local_2d8,(string *)__x);
        it.container = (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_2d8;
        local_2d8.prec = iVar4;
        std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::push
                  (&local_358,&local_2d8);
        goto LAB_001744b8;
      }
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_front(&stack,&__x->tok);
      it.container = (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)__x;
    }
LAB_001744c0:
    local_2f8._M_cur = (_Elt_pointer)((long)local_2f8._M_cur + 0x20);
    if (local_2f8._M_cur == local_2f8._M_last) {
      local_2f8._M_cur = local_2f8._M_node[1];
      local_2f8._M_last = (_Elt_pointer)&((value_type *)((long)local_2f8._M_cur + 0x1e0))->prec;
      local_2f8._M_first = local_2f8._M_cur;
      local_2f8._M_node = local_2f8._M_node + 1;
    }
  }
  do {
    if (local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur ==
        local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur) {
      std::
      _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_Deque_base(local_300,
                    &stack.
                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   );
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~deque(&lexer.token_buffer.c);
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~deque(&tokens);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::~stack
                (&local_358);
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~deque(&stack);
      return (stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_300;
    }
    if (local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur ==
        local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      if (local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
          super__Deque_impl_data._M_finish._M_node[-1][0xb].prec - 1U < 0x61) {
        poVar7 = local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
        goto LAB_0017454d;
      }
    }
    else {
      poVar7 = local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur[-1].prec - 1U < 0x61) {
LAB_0017454d:
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_front(&stack,&poVar7[-1].tok);
      }
    }
    std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::pop(&local_358);
  } while( true );
}

Assistant:

std::stack<std::string> rpn_parse_v2(std::string expr)
{
	static const int prec_value = 0;
	static const int prec_unary = 1;
	static const int prec_comma = 98;
	static const int prec_paren = 99;

	auto prec_is_op = [](int prec) { return prec > 0 && prec < 98; };

	auto op_prec = [](char c)
	{
		switch (c)
		{
			case '!': case '~':
				return 2;
			case '*': case '/': case '%':
				return 3;
			case '+': case '-':
				return 4;
			case '<': case op_lte: case '>': case op_gte:
				return 5;
			case '=': case op_ne:
				return 6;
			case '^':
				return 7;
			case '|':
				return 8;
			case '&':
				return 9;
			case op_and:
				return 10;
			case op_or:
				return 11;
			case ',':
				return prec_comma;
			case '(': case ')':
				return prec_paren;
		}

		return prec_value;
	};

	// The result is built up in reverse order
	std::deque<std::string> stack;
	struct op_stack_t { std::string tok; int prec; };
	std::stack<op_stack_t> op_stack;

	std::stringstream ss(expr);
	std::deque<std::string> tokens;
	Lexer lexer(ss);
	lexer.Lex(std::front_inserter(tokens));

	for (auto it = tokens.begin(); it != tokens.end(); ++it)
	{
		auto& tok = *it;
		rpn_map_multichar_op(tok);
		int prec = op_prec(tok[0]);

		if (prec == prec_value)
		{
			stack.push_front(tok);
			continue;
		}

		if (prec == prec_paren && tok[0] == ')')
		{
			op_stack.push({tok, prec});
			continue;
		}

		if (prec_is_op(prec))
		{
			bool is_unary = false;

			if ((it + 1) == tokens.end())
			{
				is_unary = true;
			}
			else
			{
				auto& prev_tok = *(it + 1);
				int prev_prec = op_prec(prev_tok[0]);

				if (prev_prec != 0 && prev_tok != ")")
					is_unary = true;
			}

			if (is_unary)
			{
				prec = prec_unary;

				if (tok[0] == '-')
					tok = op_neg;

				while (!op_stack.empty() && (op_stack.top().prec <= prec))
				{
					stack.push_front(op_stack.top().tok);
					op_stack.pop();
				}
			}
			else
			{
				while (!op_stack.empty() && (op_stack.top().prec < prec))
				{
					stack.push_front(op_stack.top().tok);
					op_stack.pop();
				}
			}
		}
		else if (prec == prec_comma)
		{
			while (!op_stack.empty() && (op_stack.top().prec <= prec))
			{
				stack.push_front(op_stack.top().tok);
				op_stack.pop();
			}
		}
		else if (prec == prec_paren)
		{
			while (!op_stack.empty())
			{
				if (op_stack.top().prec == prec_paren)
				{
					op_stack.pop();
					break;
				}

				stack.push_front(op_stack.top().tok);
				op_stack.pop();
			}
		}

		if (prec_is_op(prec))
			op_stack.push({tok, prec});
	}

	for (; !op_stack.empty(); op_stack.pop())
	{
		int prec = op_stack.top().prec;
		if (prec_is_op(prec))
			stack.push_front(op_stack.top().tok);
	}

	return std::stack<std::string>(std::move(stack));
}